

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O0

void duckdb::Prefix::Free(ART *art,Node *node)

{
  bool bVar1;
  IndexPointer in_RSI;
  Prefix prefix;
  Node next;
  FixedSizeAllocator *in_stack_00000088;
  IndexPointer in_stack_00000090;
  NType NVar2;
  ART *in_stack_ffffffffffffffc0;
  Node *in_stack_ffffffffffffffc8;
  ART *in_stack_ffffffffffffffd0;
  undefined6 local_28;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  ART *in_stack_ffffffffffffffe0;
  Prefix *in_stack_ffffffffffffffe8;
  
  Node::Node((Node *)0x18cd2a8);
  while( true ) {
    bVar1 = IndexPointer::HasMetadata((IndexPointer *)in_RSI.data);
    NVar2 = false;
    if (bVar1) {
      NVar2 = Node::GetType((Node *)0x18cd2cb);
      NVar2 = NVar2 == PREFIX;
    }
    if ((bool)NVar2 == false) break;
    in_stack_ffffffffffffffc8 = *(Node **)in_RSI.data;
    Prefix(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,(Node)in_RSI.data,
           (bool)in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
    in_stack_ffffffffffffffe8 =
         *(Prefix **)
          CONCAT17(in_stack_ffffffffffffffdf,CONCAT16(in_stack_ffffffffffffffde,local_28));
    Node::GetAllocator(in_stack_ffffffffffffffc0,NVar2);
    in_stack_ffffffffffffffc0 = (ART *)((IndexPointer *)in_RSI.data)->data;
    FixedSizeAllocator::Free(in_stack_00000088,in_stack_00000090);
    ((IndexPointer *)in_RSI.data)->data = (idx_t)in_stack_ffffffffffffffe8;
  }
  Node::Free(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  IndexPointer::Clear((IndexPointer *)in_RSI.data);
  return;
}

Assistant:

void Prefix::Free(ART &art, Node &node) {
	Node next;

	while (node.HasMetadata() && node.GetType() == PREFIX) {
		Prefix prefix(art, node, true);
		next = *prefix.ptr;
		Node::GetAllocator(art, PREFIX).Free(node);
		node = next;
	}

	Node::Free(art, node);
	node.Clear();
}